

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

int do_handle_define(dmr_C *C,stream *stream,token **line,token *token,int attr)

{
  allocator *A;
  position *ppVar1;
  ulong uVar2;
  ulong *puVar3;
  uint *puVar4;
  dmr_C *C_00;
  char cVar5;
  int iVar6;
  position pVar7;
  position pVar8;
  symbol *sym;
  position pVar9;
  position pVar10;
  position pVar11;
  uint uVar12;
  token *arglist;
  ident *piVar13;
  uint uVar14;
  token *list2;
  token *list2_00;
  char *pcVar15;
  bool bVar16;
  int iVar17;
  position *p;
  position local_60;
  position local_58;
  position local_50;
  position local_48;
  uint local_40;
  uint local_3c;
  dmr_C *local_38;
  
  ppVar1 = (position *)stream->name;
  if (((ulong)*ppVar1 & 0x3f) != 2) {
    dmrC_sparse_error(C,*(position *)stream,"expected identifier to \'define\'");
    return 1;
  }
  uVar12 = (uint)line;
  pVar8 = ppVar1[1];
  local_48 = ppVar1[2];
  pVar7 = *(position *)pVar8;
  pVar9 = pVar8;
  local_38 = C;
  if ((pVar7._0_4_ >> 0x15 & 1) == 0) {
    if (((pVar7._0_4_ & 0x3f) == 0x11) && (*(uint *)((long)pVar8 + 0x10) == 0x28)) {
      pVar11 = *(position *)((long)pVar8 + 8);
      *(ulong *)pVar8 = (ulong)pVar7 & 0xffffffffffdfffc0 | 0x1a;
      *(uint *)((long)pVar8 + 0x10) = *(uint *)((long)pVar8 + 0x10) & 0x80000000;
      pVar7 = *(position *)pVar11;
      uVar14 = pVar7._0_4_ & 0x3f;
      if (uVar14 == 2) {
        piVar13 = *(ident **)((long)pVar11 + 0x10);
        while (piVar13 != C->S->__VA_ARGS___ident) {
          uVar14 = *(uint *)((long)pVar8 + 0x10) + 1 & 0x3ff;
          *(uint *)((long)pVar8 + 0x10) = *(uint *)((long)pVar8 + 0x10) & 0xfffffc00 | uVar14;
          if (uVar14 == 0) goto LAB_001205bc;
          pVar9 = *(position *)((long)pVar11 + 8);
          uVar2 = *(ulong *)pVar9;
          if (((uint)uVar2 & 0x3f) != 0x11) {
LAB_00120530:
            pVar10 = pVar11;
            pVar11 = pVar9;
            if (pVar9 != (position)&dmrC_eof_token_entry_) goto LAB_00120539;
            goto LAB_001205a6;
          }
          uVar14 = *(uint *)((long)pVar9 + 0x10);
          if (uVar14 != 0x2c) {
            if (uVar14 == 0x29) {
              *(ulong *)pVar9 = uVar2 & 0xffffffffffffffc0 | 0x1a;
              *(uint *)((long)pVar9 + 0x10) = 0;
              pVar9 = *(position *)((long)pVar9 + 8);
              *(token **)(*(long *)((long)pVar11 + 8) + 8) = &dmrC_eof_token_entry_;
              goto LAB_001205d3;
            }
            if (uVar14 != 0x117) goto LAB_00120530;
            puVar4 = *(uint **)((long)pVar9 + 8);
            pVar10 = pVar9;
            if (((*puVar4 & 0x3f) != 0x11) || (puVar4[4] != 0x29)) goto LAB_001205a6;
            *(ulong *)pVar9 = uVar2 & 0xffffffffffffffc0 | 0x1a;
            *(uint *)((long)pVar9 + 0x10) = 0x40000000;
            *(token **)(*(long *)((long)pVar11 + 8) + 8) = &dmrC_eof_token_entry_;
            pVar9 = *(position *)(puVar4 + 2);
            goto LAB_001205d3;
          }
          *(ulong *)pVar9 = uVar2 & 0xffffffffffffffc0 | 0x1a;
          *(uint *)((long)pVar9 + 0x10) = 0;
          pVar11 = *(position *)((long)pVar9 + 8);
          pVar7 = *(position *)pVar11;
          uVar14 = pVar7._0_4_ & 0x3f;
          if (uVar14 != 2) goto LAB_001203e9;
          piVar13 = *(ident **)((long)pVar11 + 0x10);
        }
        pcVar15 = "__VA_ARGS__ can only appear in the expansion of a C99 variadic macro";
LAB_001205c9:
        pVar9 = (position)0x0;
        dmrC_sparse_error(C,pVar7,pcVar15);
      }
      else if ((uVar14 == 0x11) && (*(uint *)((long)pVar11 + 0x10) == 0x29)) {
        pVar9 = *(position *)((long)pVar11 + 8);
        *(token **)((long)pVar8 + 8) = &dmrC_eof_token_entry_;
      }
      else {
LAB_001203e9:
        if ((uVar14 == 0x11) && (*(uint *)((long)pVar11 + 0x10) == 0x117)) {
          puVar3 = *(ulong **)((long)pVar11 + 8);
          *(ulong *)pVar11 = (ulong)pVar7 & 0xffffffffffffffc0 | 2;
          *(ident **)((long)pVar11 + 0x10) = C->S->__VA_ARGS___ident;
          pVar10 = pVar11;
          if (((*puVar3 & 0x3f) != 0x11) || ((uint)puVar3[2] != 0x29)) {
LAB_001205a6:
            pVar7 = *(position *)pVar10;
            pcVar15 = "missing \')\' in macro parameter list";
            goto LAB_001205c9;
          }
          uVar14 = *(uint *)((long)pVar8 + 0x10) + 1 & 0x3ff;
          *(uint *)((long)pVar8 + 0x10) = *(uint *)((long)pVar8 + 0x10) & 0xfffffc00 | uVar14;
          if (uVar14 == 0) {
LAB_001205bc:
            pVar7 = *(position *)pVar11;
            pcVar15 = "too many arguments in macro definition";
            goto LAB_001205c9;
          }
          pVar9 = *(position *)(puVar3 + 1);
          *puVar3 = *puVar3 & 0xffffffffffffffc0 | 0x1a;
          *(uint *)(puVar3 + 2) = (uint)puVar3[2] & 0x80000000 | 0x40000000;
          *(token **)(*(long *)((long)pVar11 + 8) + 8) = &dmrC_eof_token_entry_;
        }
        else {
          pVar10 = pVar9;
          if (pVar11 == (position)&dmrC_eof_token_entry_) goto LAB_001205a6;
          if ((uVar14 == 0x11) && (*(uint *)((long)pVar11 + 0x10) == 0x2c)) {
            pcVar15 = "parameter name missing";
            goto LAB_001205c9;
          }
LAB_00120539:
          pcVar15 = dmrC_show_token(C,(token *)pVar11);
          pVar9 = (position)0x0;
          dmrC_sparse_error(C,*(position *)pVar11,"\"%s\" may not appear in macro parameter list",
                            pcVar15);
        }
      }
LAB_001205d3:
      if (pVar9 == (position)0x0) {
        return 1;
      }
      goto LAB_0011fede;
    }
    pVar9 = (position)&dmrC_eof_token_entry_;
    if (pVar8 != (position)&dmrC_eof_token_entry_) {
      dmrC_warning(C,pVar7,"no whitespace before object-like macro body");
      pVar9 = pVar8;
    }
  }
  pVar8 = (position)0x0;
LAB_0011fede:
  local_58 = pVar9;
  local_50 = pVar8;
  if (((SUB84(*(position *)pVar9,0) & 0x3f) == 0x11) && (*(uint *)((long)pVar9 + 0x10) == 0x111)) {
    dmrC_sparse_error(C,*(position *)pVar9,"\'##\' cannot appear at the ends of macro expansion");
    pVar8 = (position)0x0;
  }
  else {
    local_3c = uVar12;
    if (pVar9 == (position)&dmrC_eof_token_entry_) {
      p = &local_58;
    }
    else {
      A = &C->token_allocator;
      p = &local_58;
      do {
        pVar7 = pVar9;
        if ((((*(uint *)pVar9 & 0x3f) == 0x11) && (*(uint *)((long)pVar9 + 0x10) == 0x23)) &&
           (pVar7 = (position)handle_hash(C,(token **)p,(token *)pVar8), pVar7 == (position)0x0)) {
LAB_0012022b:
          pVar8 = (position)0x0;
          uVar12 = local_3c;
          goto LAB_00120183;
        }
        uVar12 = **(uint **)((long)pVar7 + 8) & 0x3f;
        if ((uVar12 == 0x11) && ((*(uint **)((long)pVar7 + 8))[4] == 0x111)) {
          arglist = (token *)0x0;
          if ((*(uint *)pVar7 & 0x3f) == 0x11) {
            arglist = (token *)(ulong)(*(int *)((long)pVar7 + 0x10) == 0x2c);
          }
          local_40 = (uint)arglist;
          try_arg((dmr_C *)pVar7,(token *)0x16,pVar8._0_4_,arglist);
          pVar9 = pVar7;
          local_60 = pVar7;
          do {
            pVar8 = *(position *)((long)*(position *)((long)pVar9 + 8) + 8);
            uVar12 = *(uint *)pVar8;
            pVar11 = *(position *)((long)pVar9 + 8);
            while ((pVar7 = pVar8, pVar8 = local_50, (uVar12 & 0x3f) == 0x11 &&
                   (*(uint *)((long)pVar7 + 0x10) == 0x111))) {
              *(position *)((long)pVar9 + 8) = pVar7;
              dmrC_allocator_free(A,(void *)pVar11);
              uVar12 = *(uint *)*(position *)((long)pVar7 + 8);
              pVar8 = *(position *)((long)pVar7 + 8);
              pVar11 = pVar7;
            }
            *(ulong *)pVar11 = *(ulong *)pVar11 & 0xffffffffffffffc0 | 0x17;
            if (pVar7 == (position)&dmrC_eof_token_entry_) {
              cVar5 = '\x06';
              pVar7 = pVar9;
            }
            else if ((((*(uint *)pVar7 & 0x3f) == 0x11) && (*(uint *)((long)pVar7 + 0x10) == 0x23))
                    && (pVar7 = (position)
                                handle_hash(local_38,(token **)((long)pVar11 + 8),(token *)local_50)
                       , pVar7 == (position)0x0)) {
              cVar5 = '\x01';
              pVar7 = pVar9;
            }
            else {
              uVar12 = try_arg((dmr_C *)pVar7,(token *)0x16,pVar8._0_4_,arglist);
              if (((local_40 != 1) || (uVar12 == 0)) &&
                 (uVar12 = 0, local_60 = pVar7, (*(uint *)pVar7 & 0x3f) == 0x11)) {
                uVar12 = (uint)(*(int *)((long)pVar7 + 0x10) == 0x2c);
              }
              arglist = *(token **)((long)pVar7 + 8);
              cVar5 = '\x03';
              local_40 = uVar12;
              if (((ulong)arglist->pos & 0x3f) == 0x11) {
                cVar5 = ((arglist->field_2).special != 0x111) * '\x03';
              }
            }
            C = local_38;
            pVar9 = pVar7;
          } while (cVar5 == '\0');
          if (cVar5 == '\x06') {
            dmrC_sparse_error(local_38,*(position *)pVar11,
                              "\'##\' cannot appear at the ends of macro expansion");
LAB_001200fd:
            pVar7 = (position)0x0;
          }
          else {
            if (cVar5 != '\x03') goto LAB_001200fd;
            if (local_40 == 2) {
              *(ulong *)local_60 = *(ulong *)local_60 & 0xffffffffffffffc0 | 0x18;
            }
          }
          if (pVar7 == (position)0x0) goto LAB_0012022b;
        }
        else {
          try_arg((dmr_C *)pVar7,(token *)0x14,pVar8._0_4_,(token *)(ulong)uVar12);
        }
        uVar12 = SUB84(*(position *)pVar7,0) & 0x3f;
        if (uVar12 - 0xf < 2) {
          **(uint **)((long)pVar7 + 0x10) = **(uint **)((long)pVar7 + 0x10) | 0x80000000;
        }
        else if (uVar12 == 1) {
          pVar8 = (position)0x0;
          dmrC_sparse_error(C,*(position *)pVar7,"too many instances of argument in body");
          uVar12 = local_3c;
          goto LAB_00120183;
        }
        pVar9 = *(position *)((long)pVar7 + 8);
        p = (position *)((long)pVar7 + 8);
      } while (pVar9 != (position)&dmrC_eof_token_entry_);
    }
    pVar8 = (position)alloc_token(C,(position *)local_58);
    *(ulong *)pVar8 = *(ulong *)pVar8 & 0xffffffffffffffc0 | 0x19;
    ((anon_union_8_7_c7bfca54_for_token_2 *)((long)pVar8 + 0x10))->ident = (ident *)local_48;
    *(position *)((long)pVar8 + 8) = *p;
    *p = pVar8;
    pVar8 = local_58;
    uVar12 = local_3c;
  }
LAB_00120183:
  if (pVar8 == (position)0x0) {
    return 1;
  }
  sym = dmrC_lookup_symbol((ident *)local_48,NS_UNDEF|NS_MACRO);
  if (sym == (symbol *)0x0) {
    iVar17 = 1;
  }
  else {
    uVar14 = *(uint *)sym >> 0x12 & 3;
    iVar17 = 1;
    if ((int)uVar12 < (int)uVar14) {
      bVar16 = false;
    }
    else {
      bVar16 = (*(uint *)sym & 0x1ff00) == 0x100;
      iVar6 = token_list_different((dmr_C *)(sym->field_14).field_0.expansion,(token *)pVar8,list2);
      if ((iVar6 == 0) &&
         (iVar6 = token_list_different
                            ((dmr_C *)(sym->field_14).field_0.arglist,(token *)local_50,list2_00),
         iVar6 == 0)) {
        bVar16 = !bVar16 || uVar14 != uVar12;
      }
      else {
        C_00 = local_38;
        if ((uVar12 == 1 && (bVar16 && uVar14 == uVar12)) ||
           ((sym->field_14).field_0.used_in == local_38->file_scope)) {
          iVar17 = 0;
          dmrC_warning(local_38,*ppVar1,"preprocessor token %.*s redefined",
                       (ulong)*(byte *)((long)local_48 + 0x10),(long)local_48 + 0x12);
          dmrC_info(C_00,sym->pos,"this was the original definition");
          bVar16 = true;
        }
        else {
          bVar16 = true;
          iVar17 = 0;
        }
      }
    }
    C = local_38;
    if (!bVar16) {
      return iVar17;
    }
  }
  if ((sym == (symbol *)0x0) || (sym->scope != C->file_scope)) {
    sym = dmrC_alloc_symbol(C->S,*ppVar1,3);
    pVar7 = local_48;
    dmrC_bind_symbol(C->S,sym,(ident *)local_48,NS_MACRO);
    ptrlist_add((ptr_list **)&C->macros,(void *)pVar7,&C->ptrlist_allocator);
    iVar17 = 0;
  }
  if (iVar17 == 0) {
    (sym->field_14).field_0.expansion = (token *)pVar8;
    (sym->field_14).field_0.arglist = (token *)local_50;
    dmrC_allocator_free(&C->token_allocator,stream);
  }
  uVar14 = *(uint *)sym;
  (sym->field_14).field_0.used_in = (scope *)0x0;
  *(uint *)sym = uVar14 & 0xfff201ff | 0x100 | (uVar12 & 3) << 0x12;
  return iVar17;
}

Assistant:

static int do_handle_define(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token, int attr)
{
	struct token *arglist, *expansion;
	struct token *left = token->next;
	struct symbol *sym;
	struct ident *name;
	int ret;

        (void) stream;
        (void) line;
        
	if (dmrC_token_type(left) != TOKEN_IDENT) {
		dmrC_sparse_error(C, token->pos, "expected identifier to 'define'");
		return 1;
	}

	name = left->ident;

	arglist = NULL;
	expansion = left->next;
	if (!expansion->pos.whitespace) {
		if (dmrC_match_op(expansion, '(')) {
			arglist = expansion;
			expansion = parse_arguments(C, expansion);
			if (!expansion)
				return 1;
		} else if (!dmrC_eof_token(expansion)) {
			dmrC_warning(C, expansion->pos,
				"no whitespace before object-like macro body");
		}
	}

	expansion = parse_expansion(C, expansion, arglist, name);
	if (!expansion)
		return 1;

	ret = 1;
	sym = dmrC_lookup_symbol(name, (enum namespace_type) (NS_MACRO | NS_UNDEF));
	if (sym) {
		int clean;

		if (attr < sym->attr)
			goto out;

		clean = (attr == sym->attr && sym->ns == NS_MACRO);

		if (token_list_different(C, sym->expansion, expansion) ||
		    token_list_different(C, sym->arglist, arglist)) {
			ret = 0;
			if ((clean && attr == SYM_ATTR_NORMAL)
					|| sym->used_in == C->file_scope) {
				dmrC_warning(C, left->pos, "preprocessor token %.*s redefined",
						name->len, name->name);
				dmrC_info(C, sym->pos, "this was the original definition");
			}
		} else if (clean)
			goto out;
	}

	if (!sym || sym->scope != C->file_scope) {
		sym = dmrC_alloc_symbol(C->S, left->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, name, NS_MACRO);
		dmrC_add_ident(C, &C->macros, name);
		ret = 0;
	}

	if (!ret) {
		sym->expansion = expansion;
		sym->arglist = arglist;
		dmrC_allocator_free(&C->token_allocator, token);	/* Free the "define" token, but not the rest of the line */
	}

	sym->ns = NS_MACRO;
	sym->used_in = NULL;
	sym->attr = attr;
out:
	return ret;
}